

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDEdge::TaggedEndIndex(ON_SubDEdge *this)

{
  uint uVar1;
  uint evi;
  long lVar2;
  bool bVar3;
  
  uVar1 = 3;
  lVar2 = 0;
  do {
    if ((this->m_vertex[lVar2] != (ON_SubDVertex *)0x0) &&
       ((byte)(this->m_vertex[lVar2]->m_vertex_tag - Crease) < 3)) {
      bVar3 = uVar1 == 3;
      uVar1 = 2;
      if (bVar3) {
        uVar1 = (uint)lVar2;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdge::TaggedEndIndex() const
{
  unsigned int tagged_end_index = 3;
  for (unsigned int evi = 0; evi < 2; evi++)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr == v || false == v->IsDartOrCreaseOrCorner())
      continue;
    tagged_end_index = (3 == tagged_end_index) ? evi : 2;
  }
  return tagged_end_index;
}